

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.cpp
# Opt level: O1

bool __thiscall zmq::pipe_t::check_write(pipe_t *this)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  
  bVar2 = false;
  if (((this->_out_active == true) && (bVar2 = false, this->_state == active)) &&
     (uVar1 = this->_hwm, bVar3 = this->_msgs_written - this->_peers_msgs_read < (ulong)uVar1,
     bVar2 = bVar3 || (int)uVar1 < 1, !bVar3 && (int)uVar1 >= 1)) {
    this->_out_active = false;
    return false;
  }
  return bVar2;
}

Assistant:

bool zmq::pipe_t::check_write ()
{
    if (unlikely (!_out_active || _state != active))
        return false;

    const bool full = !check_hwm ();

    if (unlikely (full)) {
        _out_active = false;
        return false;
    }

    return true;
}